

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O2

string<char> __thiscall
irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::replaceSpecialCharacters
          (CXMLReaderImpl<char,_irr::io::IXMLBase> *this,string<char> *origstr)

{
  bool bVar1;
  s32 sVar2;
  string<char> *in_RDX;
  undefined8 extraout_RDX;
  undefined8 uVar3;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  long lVar4;
  int i;
  long lVar5;
  s32 begin;
  int iVar6;
  s32 length;
  string<char> sVar7;
  string<char> local_40;
  
  sVar2 = core::string<char>::findFirst(in_RDX,'&');
  if (sVar2 == -1) {
    core::string<char>::string((string<char> *)this,in_RDX);
    uVar3 = extraout_RDX_02;
  }
  else {
    core::string<char>::string((string<char> *)this);
    length = 0;
    uVar3 = extraout_RDX;
    while( true ) {
      begin = (s32)in_RDX;
      if ((sVar2 == -1) || (in_RDX->used + -3 <= sVar2)) break;
      lVar4 = 0;
      for (lVar5 = 0; lVar5 < *(int *)((long)&origstr[6].array + 4); lVar5 = lVar5 + 1) {
        bVar1 = equalsn((CXMLReaderImpl<char,_irr::io::IXMLBase> *)origstr,
                        (char *)(*(long *)(*(long *)&origstr[5].allocated + lVar4) + 1),
                        in_RDX->array + (long)sVar2 + 1,
                        *(int *)(*(long *)&origstr[5].allocated + 0xc + lVar4) + -2);
        if (bVar1) {
          core::string<char>::subString(&local_40,begin,length);
          core::string<char>::append((string<char> *)this,&local_40);
          core::string<char>::~string(&local_40);
          core::string<char>::append
                    ((string<char> *)this,**(char **)(*(long *)&origstr[5].allocated + lVar4));
          iVar6 = *(int *)(*(long *)&origstr[5].allocated + 0xc + lVar4) + -1;
          goto LAB_005afa5a;
        }
        lVar4 = lVar4 + 0x10;
      }
      core::string<char>::subString(&local_40,begin,length);
      core::string<char>::append((string<char> *)this,&local_40);
      core::string<char>::~string(&local_40);
      iVar6 = 1;
LAB_005afa5a:
      length = iVar6 + sVar2;
      sVar2 = core::string<char>::findNext(in_RDX,'&',length);
      uVar3 = extraout_RDX_00;
    }
    if (length < in_RDX->used + -2) {
      core::string<char>::subString(&local_40,begin,length);
      core::string<char>::append((string<char> *)this,&local_40);
      core::string<char>::~string(&local_40);
      uVar3 = extraout_RDX_01;
    }
  }
  sVar7.allocated = (int)uVar3;
  sVar7.used = (int)((ulong)uVar3 >> 0x20);
  sVar7.array = (char *)this;
  return sVar7;
}

Assistant:

core::string<char_type> replaceSpecialCharacters(
		core::string<char_type>& origstr)
	{
		int pos = origstr.findFirst(L'&');
		int oldPos = 0;

		if (pos == -1)
			return origstr;

		core::string<char_type> newstr;

		while(pos != -1 && pos < origstr.size()-2)
		{
			// check if it is one of the special characters

			int specialChar = -1;
			for (int i=0; i<(int)SpecialCharacters.size(); ++i)
			{
				const char_type* p = &origstr.c_str()[pos]+1;

				if (equalsn(&SpecialCharacters[i][1], p, SpecialCharacters[i].size()-1))
				{
					specialChar = i;
					break;
				}
			}

			if (specialChar != -1)
			{
				newstr.append(origstr.subString(oldPos, pos - oldPos));
				newstr.append(SpecialCharacters[specialChar][0]);
				pos += SpecialCharacters[specialChar].size();
			}
			else
			{
				newstr.append(origstr.subString(oldPos, pos - oldPos + 1));
				pos += 1;
			}

			// find next &
			oldPos = pos;
			pos = origstr.findNext(L'&', pos);		
		}

		if (oldPos < origstr.size()-1)
			newstr.append(origstr.subString(oldPos, origstr.size()-oldPos));

		return newstr;
	}